

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

TheoryAtom * Potassco::TheoryAtom::newAtom(Id_t a,Id_t term,IdSpan *args)

{
  size_t sVar1;
  TheoryAtom *pTVar2;
  IdSpan *in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  IdSpan *unaff_retaddr;
  
  sVar1 = nBytes<Potassco::TheoryAtom>(in_RDX);
  pTVar2 = (TheoryAtom *)operator_new(sVar1);
  TheoryAtom((TheoryAtom *)CONCAT44(a,term),args._4_4_,(Id_t)args,unaff_retaddr,
             (Id_t *)CONCAT44(in_EDI,in_ESI),(Id_t *)in_RDX);
  return pTVar2;
}

Assistant:

TheoryAtom* TheoryAtom::newAtom(Id_t a, Id_t term, const IdSpan& args) {
	return new (::operator new(nBytes<TheoryAtom>(args))) TheoryAtom(a, term, args, 0, 0);
}